

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynbuf.c
# Opt level: O0

CURLcode curlx_dyn_setlen(dynbuf *s,size_t set)

{
  size_t set_local;
  dynbuf *s_local;
  
  if (s->leng < set) {
    s_local._4_4_ = CURLE_BAD_FUNCTION_ARGUMENT;
  }
  else {
    s->leng = set;
    s->bufr[s->leng] = '\0';
    s_local._4_4_ = CURLE_OK;
  }
  return s_local._4_4_;
}

Assistant:

CURLcode Curl_dyn_setlen(struct dynbuf *s, size_t set)
{
  DEBUGASSERT(s);
  DEBUGASSERT(s->init == DYNINIT);
  DEBUGASSERT(!s->leng || s->bufr);
  if(set > s->leng)
    return CURLE_BAD_FUNCTION_ARGUMENT;
  s->leng = set;
  s->bufr[s->leng] = 0;
  return CURLE_OK;
}